

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
::insert_column<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
           *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *column)

{
  pointer puVar1;
  pointer puVar2;
  Dimension dim;
  
  puVar1 = (column->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = (column->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  dim = 0;
  if (puVar1 != puVar2) {
    dim = (int)((ulong)((long)puVar1 - (long)puVar2) >> 2) + -1;
  }
  _container_insert<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            (this,column,*(Index *)(this + 0x38),dim);
  *(int *)(this + 0x38) = *(int *)(this + 0x38) + 1;
  return;
}

Assistant:

inline void Base_matrix<Master_matrix>::insert_column(const Container& column)
{
  //TODO: dim not actually stored right now, so either get rid of it or store it again
  _insert(column, nextInsertIndex_, column.size() == 0 ? 0 : column.size() - 1);
  ++nextInsertIndex_;
}